

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ReReloop.cpp
# Opt level: O3

void wasm::ReReloop::BreakTask::handle(ReReloop *parent,Break *curr)

{
  Block *this;
  Expression *pEVar1;
  Block *after;
  mapped_type *ppBVar2;
  Block *Target;
  key_type local_30;
  
  this = parent->currCFGBlock;
  local_30.super_IString.str._M_len = (curr->name).super_IString.str._M_len;
  local_30.super_IString.str._M_str = (curr->name).super_IString.str._M_str;
  ppBVar2 = std::
            map<wasm::Name,_CFG::Block_*,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_CFG::Block_*>_>_>
            ::operator[](&parent->breakTargets,&local_30);
  CFG::Block::AddBranchTo(this,*ppBVar2,curr->condition,(Expression *)0x0);
  pEVar1 = curr->condition;
  Target = startCFGBlock(parent);
  if (pEVar1 != (Expression *)0x0) {
    CFG::Block::AddBranchTo(this,Target,(Expression *)0x0,(Expression *)0x0);
  }
  return;
}

Assistant:

static void handle(ReReloop& parent, Break* curr) {
      // add the branch. note how if the condition is false, it is the right
      // value there as well
      auto* before = parent.getCurrCFGBlock();
      parent.addBranch(
        before, parent.getBreakTarget(curr->name), curr->condition);
      if (curr->condition) {
        auto* after = parent.startCFGBlock();
        parent.addBranch(before, after);
      } else {
        parent.stopControlFlow();
      }
    }